

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputeOriginalValues
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CorrType *in_corr,int *out_data,int param_3,int num_components,
          PointIndex *entry_to_point_id_map)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar1;
  pointer pIVar2;
  pointer piVar3;
  bool bVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  if (num_components == 2) {
    this->num_components_ = 2;
    this->entry_to_point_id_map_ = entry_to_point_id_map;
    piVar5 = (int *)operator_new__(8);
    piVar6 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = piVar5;
    if (piVar6 != (int *)0x0) {
      operator_delete__(piVar6);
    }
    (this->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_ = 2;
    this_00 = &(this->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_;
    std::vector<int,_std::allocator<int>_>::resize(this_00,2);
    pvVar1 = (this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ).mesh_data_.data_to_corner_map_;
    uVar7 = (uint)((ulong)((long)(pvVar1->
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar1->
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2);
    if ((int)uVar7 < 1) {
      bVar4 = true;
    }
    else {
      uVar11 = 0;
      piVar6 = out_data;
      do {
        pvVar1 = (this->
                 super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ).mesh_data_.data_to_corner_map_;
        pIVar2 = (pvVar1->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar1->
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 2) <= uVar11
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        bVar4 = ComputePredictedValue(this,(CornerIndex)pIVar2[uVar11].value_,out_data,(int)uVar11);
        if (!bVar4) goto LAB_0016385c;
        if (0 < (this->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                ).
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                .transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_) {
          piVar5 = (this->predicted_value_)._M_t.
                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = 0;
          do {
            iVar8 = piVar5[lVar9];
            iVar10 = (this->
                     super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                     ).
                     super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                     .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
            if ((iVar10 < iVar8) ||
               (iVar10 = (this->
                         super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                         ).
                         super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                         .transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_,
               iVar8 < iVar10)) {
              piVar3[lVar9] = iVar10;
            }
            else {
              piVar3[lVar9] = iVar8;
            }
            lVar9 = lVar9 + 1;
            iVar8 = (this->
                    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                    ).
                    super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                    .transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_;
          } while (lVar9 < iVar8);
          if (0 < iVar8) {
            lVar9 = 0;
            do {
              iVar8 = in_corr[lVar9] + piVar3[lVar9];
              piVar6[lVar9] = iVar8;
              if ((this->
                  super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  ).
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ < iVar8) {
                iVar10 = -(this->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
LAB_00163837:
                piVar6[lVar9] = iVar8 + iVar10;
              }
              else if (iVar8 < (this->
                               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                               ).
                               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                               .transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_)
              {
                iVar10 = (this->
                         super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                         ).
                         super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                         .transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
                goto LAB_00163837;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < (this->
                             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                             ).
                             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                             .transform_.super_PredictionSchemeWrapTransformBase<int>.
                             num_components_);
          }
        }
        uVar11 = uVar11 + 1;
        piVar6 = piVar6 + 2;
        in_corr = in_corr + 2;
      } while (uVar11 != (uVar7 & 0x7fffffff));
    }
  }
  else {
LAB_0016385c:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputeOriginalValues(const CorrType *in_corr, DataTypeT *out_data,
                          int /* size */, int num_components,
                          const PointIndex *entry_to_point_id_map) {
  if (num_components != 2) {
    // Corrupt/malformed input. Two output components are req'd.
    return false;
  }
  num_components_ = num_components;
  entry_to_point_id_map_ = entry_to_point_id_map;
  predicted_value_ =
      std::unique_ptr<DataTypeT[]>(new DataTypeT[num_components]);
  this->transform().Init(num_components);

  const int corner_map_size =
      static_cast<int>(this->mesh_data().data_to_corner_map()->size());
  for (int p = 0; p < corner_map_size; ++p) {
    const CornerIndex corner_id = this->mesh_data().data_to_corner_map()->at(p);
    if (!ComputePredictedValue(corner_id, out_data, p)) {
      return false;
    }

    const int dst_offset = p * num_components;
    this->transform().ComputeOriginalValue(
        predicted_value_.get(), in_corr + dst_offset, out_data + dst_offset);
  }
  return true;
}